

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

Value * __thiscall
duckdb::Appender::GetDefaultValue(Value *__return_storage_ptr__,Appender *this,idx_t column)

{
  pointer pLVar1;
  pointer pLVar2;
  ulong uVar3;
  pointer pcVar4;
  reference pvVar5;
  pointer pTVar6;
  reference this_00;
  string *psVar7;
  NotImplementedException *this_01;
  InvalidInputException *this_02;
  ulong uVar8;
  _Hash_node_base *p_Var9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pLVar1 = (this->column_ids).
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar2 = (this->column_ids).
           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar1 != pLVar2) {
    if ((ulong)((long)pLVar2 - (long)pLVar1 >> 3) <= column) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Column index out of bounds","");
      InvalidInputException::InvalidInputException(this_02,&local_68);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<duckdb::LogicalIndex,_true>::operator[](&this->column_ids,column);
    column = pvVar5->index;
  }
  uVar3 = (this->default_values)._M_h._M_bucket_count;
  uVar8 = column % uVar3;
  p_Var10 = (this->default_values)._M_h._M_buckets[uVar8];
  p_Var11 = (__node_base_ptr)0x0;
  if ((p_Var10 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var10->_M_nxt, p_Var11 = p_Var10,
     (_Hash_node_base *)column != p_Var10->_M_nxt[1]._M_nxt)) {
    while (p_Var10 = p_Var9, p_Var9 = p_Var10->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var11 = (__node_base_ptr)0x0;
      if (((ulong)p_Var9[1]._M_nxt % uVar3 != uVar8) ||
         (p_Var11 = p_Var10, (_Hash_node_base *)column == p_Var9[1]._M_nxt)) goto LAB_004c46be;
    }
    p_Var11 = (__node_base_ptr)0x0;
  }
LAB_004c46be:
  if (p_Var11 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var11->_M_nxt;
  }
  if (p_Var9 == (_Hash_node_base *)0x0) {
    pTVar6 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             ::operator->(&this->description);
    this_00 = vector<duckdb::ColumnDefinition,_true>::operator[](&pTVar6->columns,column);
    psVar7 = ColumnDefinition::Name_abi_cxx11_(this_00);
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "AppendDefault is not supported for column \"%s\": not a foldable default expressions."
               ,"");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar4 = (psVar7->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar4,pcVar4 + psVar7->_M_string_length);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_01,&local_68,&local_48);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  Value::Value(__return_storage_ptr__,(Value *)(p_Var9 + 2));
  return __return_storage_ptr__;
}

Assistant:

Value Appender::GetDefaultValue(idx_t column) {
	auto index = column;

	if (!column_ids.empty()) {
		if (column >= column_ids.size()) {
			throw InvalidInputException("Column index out of bounds");
		}
		index = column_ids[column].index;
	}

	auto it = default_values.find(index);
	if (it == default_values.end()) {
		auto &name = description->columns[index].Name();
		throw NotImplementedException(
		    "AppendDefault is not supported for column \"%s\": not a foldable default expressions.", name);
	}
	return it->second;
}